

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdantzigpr.hpp
# Opt level: O2

SPxId __thiscall
soplex::SPxDantzigPR<double>::selectEnterDenseDim
          (SPxDantzigPR<double> *this,double *best,SPxId *enterId)

{
  double dVar1;
  SPxSolverBase<double> *this_00;
  DataKey DVar2;
  uint i;
  
  i = (((this->super_SPxPricer<double>).thesolver)->thecovectors->set).thenum;
  while (0 < (int)i) {
    i = i - 1;
    this_00 = (this->super_SPxPricer<double>).thesolver;
    dVar1 = (this_00->theCoTest).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[i];
    if ((dVar1 < -(this->super_SPxPricer<double>).thetolerance) && (dVar1 < *best)) {
      DVar2 = (DataKey)SPxSolverBase<double>::coId(this_00,i);
      enterId->super_DataKey = DVar2;
      *best = dVar1;
    }
  }
  return (SPxId)enterId->super_DataKey;
}

Assistant:

SPxId SPxDantzigPR<R>::selectEnterDenseDim(R& best, SPxId& enterId)
{
   assert(this->thesolver != nullptr);

   R x;

   for(int i = this->thesolver->dim() - 1; i >= 0; --i)
   {
      x = this->thesolver->coTest()[i];

      if(x < -this->thetolerance)
      {
         if(x < best)
         {
            enterId   = this->thesolver->coId(i);
            best = x;
         }
      }
   }

   return enterId;
}